

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_format.hpp
# Opt level: O2

string_t *
cfgfile::to_cfgfile_format<cfgfile::string_trait_t>(string_t *__return_storage_ptr__,string_t *what)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  char cVar5;
  size_type sVar6;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  
  if (what->_M_string_length == 0) {
    std::__cxx11::string::string(local_70,"\"\"",(allocator *)local_50);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_70);
    std::__cxx11::string::~string(local_70);
  }
  else {
    cVar5 = (char)what;
    lVar4 = std::__cxx11::string::find
                      (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_begin_tag);
    if ((((((lVar4 == -1) &&
           (lVar4 = std::__cxx11::string::find
                              (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_end_tag),
           lVar4 == -1)) &&
          (lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_quotes),
          lVar4 == -1)) &&
         ((lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::
                                                      c_carriage_return), lVar4 == -1 &&
          (lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_line_feed)
          , lVar4 == -1)))) &&
        ((lVar4 = std::__cxx11::string::find
                            (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_tab),
         lVar4 == -1 &&
         ((lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_back_slash
                             ), lVar4 == -1 &&
          (lVar4 = std::__cxx11::string::find
                             (cVar5,(ulong)(uint)(int)const_t<cfgfile::string_trait_t>::c_space),
          lVar4 == -1)))))) &&
       ((lVar4 = std::__cxx11::string::find((string *)what,0x10e218), lVar4 == -1 &&
        ((lVar4 = std::__cxx11::string::find((string *)what,0x10e240), lVar4 == -1 &&
         (lVar4 = std::__cxx11::string::find((string *)what,0x10e268), lVar4 == -1)))))) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)what);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar5 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar5);
    pcVar2 = (what->_M_dataplus)._M_p;
    sVar3 = what->_M_string_length;
    for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = pcVar2[sVar6];
      if (cVar1 == const_t<cfgfile::string_trait_t>::c_quotes) {
        std::__cxx11::string::string(local_50,"\\\"",&local_71);
        std::__cxx11::string::string(local_70,local_50);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_00103b3b:
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_50);
      }
      else {
        if (cVar1 == const_t<cfgfile::string_trait_t>::c_carriage_return) {
          std::__cxx11::string::string(local_50,"\\n",&local_71);
          std::__cxx11::string::string(local_70,local_50);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_00103b3b;
        }
        if (cVar1 == const_t<cfgfile::string_trait_t>::c_line_feed) {
          std::__cxx11::string::string(local_50,"\\r",&local_71);
          std::__cxx11::string::string(local_70,local_50);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_00103b3b;
        }
        if (cVar1 == const_t<cfgfile::string_trait_t>::c_tab) {
          std::__cxx11::string::string(local_50,"\\t",&local_71);
          std::__cxx11::string::string(local_70,local_50);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_00103b3b;
        }
        if (cVar1 == const_t<cfgfile::string_trait_t>::c_back_slash) {
          std::__cxx11::string::string(local_50,"\\\\",&local_71);
          std::__cxx11::string::string(local_70,local_50);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          goto LAB_00103b3b;
        }
        std::__cxx11::string::push_back(cVar5);
      }
    }
    std::__cxx11::string::push_back(cVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline typename Trait::string_t to_cfgfile_format(
	const typename Trait::string_t & what )
{
	if( what.empty() )
		return Trait::from_ascii( "\"\"" );

	if( what.find( const_t< Trait >::c_begin_tag ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_end_tag ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_quotes ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_carriage_return ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_line_feed ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_tab )  == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_back_slash ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_space ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_one_line_comment ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_start_multi_line_comment ) == Trait::string_t::npos &&
		what.find( const_t< Trait >::c_finish_multi_line_comment ) == Trait::string_t::npos )
			return what;
	else
	{
		typename Trait::string_t result;

		result.push_back( const_t< Trait >::c_quotes );

		for( const typename Trait::char_t & ch : what )
		{
			if( ch == const_t< Trait >::c_quotes )
				result.append( Trait::from_ascii( "\\\"" ) );
			else if( ch == const_t< Trait >::c_carriage_return )
				result.append( Trait::from_ascii( "\\n" ) );
			else if( ch == const_t< Trait >::c_line_feed )
				result.append( Trait::from_ascii( "\\r" ) );
			else if( ch == const_t< Trait >::c_tab )
				result.append( Trait::from_ascii( "\\t" ) );
			else if( ch == const_t< Trait >::c_back_slash )
				result.append( Trait::from_ascii( "\\\\" ) );
			else
				result.push_back( ch );
		}

		result.push_back( const_t< Trait >::c_quotes );

		return result;
	}
}